

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationBuilder::findCommonNode(CollationBuilder *this,int32_t index,int32_t strength)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = (this->nodes).count;
  if (index < iVar1 && -1 < index) {
    uVar3 = (uint)(this->nodes).elements[(uint)index];
  }
  else {
    uVar3 = 0;
  }
  if ((int)(uVar3 & 3) < strength) {
    if (strength == 1) {
      uVar2 = uVar3 & 0x40;
    }
    else {
      uVar2 = uVar3 & 0x20;
    }
    if (uVar2 != 0) {
      uVar3 = uVar3 >> 8 & 0xfffff;
      if ((int)uVar3 < iVar1) {
        uVar4 = (this->nodes).elements[uVar3];
      }
      else {
        uVar4 = 0;
      }
      do {
        index = (uint)(uVar4 >> 8) & 0xfffff;
        if (index < iVar1) {
          uVar4 = (this->nodes).elements[(uint)index];
        }
        else {
          uVar4 = 0;
        }
      } while ((((byte)(uVar4 >> 0x38) < 5) || ((uVar4 & 8) != 0)) ||
              (strength < (int)((uint)uVar4 & 3)));
    }
  }
  return index;
}

Assistant:

int32_t
CollationBuilder::findCommonNode(int32_t index, int32_t strength) const {
    U_ASSERT(UCOL_SECONDARY <= strength && strength <= UCOL_TERTIARY);
    int64_t node = nodes.elementAti(index);
    if(strengthFromNode(node) >= strength) {
        // The current node is no stronger.
        return index;
    }
    if(strength == UCOL_SECONDARY ? !nodeHasBefore2(node) : !nodeHasBefore3(node)) {
        // The current node implies the strength-common weight.
        return index;
    }
    index = nextIndexFromNode(node);
    node = nodes.elementAti(index);
    U_ASSERT(!isTailoredNode(node) && strengthFromNode(node) == strength &&
            weight16FromNode(node) < Collation::COMMON_WEIGHT16);
    // Skip to the explicit common node.
    do {
        index = nextIndexFromNode(node);
        node = nodes.elementAti(index);
        U_ASSERT(strengthFromNode(node) >= strength);
    } while(isTailoredNode(node) || strengthFromNode(node) > strength ||
            weight16FromNode(node) < Collation::COMMON_WEIGHT16);
    U_ASSERT(weight16FromNode(node) == Collation::COMMON_WEIGHT16);
    return index;
}